

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> * __thiscall
deqp::egl::ConfigFilter::filter
          (vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
           *__return_storage_ptr__,ConfigFilter *this,
          vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *configs)

{
  bool bVar1;
  reference pSVar2;
  __normal_iterator<const_deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
  local_38;
  __normal_iterator<const_deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
  local_30;
  const_iterator iter;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *configs_local;
  ConfigFilter *this_local;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *out;
  
  iter._M_current._7_1_ = 0;
  std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::vector
            (__return_storage_ptr__);
  local_30._M_current =
       (SurfaceConfig *)
       std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::begin
                 (configs);
  while( true ) {
    local_38._M_current =
         (SurfaceConfig *)
         std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::end
                   (configs);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
             ::operator*(&local_30);
    bVar1 = isMatch(this,pSVar2);
    if (bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
               ::operator*(&local_30);
      std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::push_back
                (__return_storage_ptr__,pSVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
    ::operator++(&local_30,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SurfaceConfig> filter (const std::vector<SurfaceConfig>& configs) const
	{
		std::vector<SurfaceConfig> out;

		for (std::vector<SurfaceConfig>::const_iterator iter = configs.begin(); iter != configs.end(); iter++)
		{
			if (isMatch(*iter)) out.push_back(*iter);
		}

		return out;
	}